

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::ExpandRuleVariable
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *variable,
          RuleVariables *replaceValues)

{
  cmMakefile *pcVar1;
  int iVar2;
  TargetType targetType;
  char **ppcVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  string *psVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  char *pcVar12;
  size_type sVar13;
  pointer pcVar14;
  bool bVar15;
  string targetBase;
  string arg1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8 [2];
  long local_d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  cmOutputConverter *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  long local_60;
  char *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((replaceValues->LinkFlags != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->LinkFlags;
    goto LAB_0023c893;
  }
  if ((replaceValues->Manifests != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Manifests;
    goto LAB_0023c893;
  }
  if ((replaceValues->Flags != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Flags;
    goto LAB_0023c893;
  }
  if ((replaceValues->Source != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Source;
    goto LAB_0023c893;
  }
  if ((replaceValues->PreprocessedSource != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->PreprocessedSource;
    goto LAB_0023c893;
  }
  if ((replaceValues->AssemblySource != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->AssemblySource;
    goto LAB_0023c893;
  }
  if ((replaceValues->Object != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Object;
    goto LAB_0023c893;
  }
  if ((replaceValues->ObjectDir != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->ObjectDir;
    goto LAB_0023c893;
  }
  if ((replaceValues->ObjectFileDir != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->ObjectFileDir;
    goto LAB_0023c893;
  }
  if ((replaceValues->Objects != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Objects;
    goto LAB_0023c893;
  }
  if ((replaceValues->ObjectsQuoted != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->ObjectsQuoted;
    goto LAB_0023c893;
  }
  if ((replaceValues->Defines != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Defines;
    goto LAB_0023c893;
  }
  if ((replaceValues->Includes != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->Includes;
    goto LAB_0023c893;
  }
  if ((replaceValues->TargetPDB != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->TargetPDB;
    goto LAB_0023c893;
  }
  if ((replaceValues->TargetCompilePDB != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->TargetCompilePDB;
    goto LAB_0023c893;
  }
  if ((replaceValues->DependencyFile != (char *)0x0) &&
     (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
    pcVar6 = replaceValues->DependencyFile;
    goto LAB_0023c893;
  }
  if (replaceValues->Target == (char *)0x0) {
LAB_0023bb26:
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if ((iVar2 != 0) &&
       ((iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0 &&
        (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0)))) {
      if ((replaceValues->LinkLibraries == (char *)0x0) ||
         (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0)) {
        if ((replaceValues->Language == (char *)0x0) ||
           (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0)) {
          if (replaceValues->CMTarget != (cmGeneratorTarget *)0x0) {
            iVar2 = std::__cxx11::string::compare((char *)variable);
            if (iVar2 == 0) {
              psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(replaceValues->CMTarget);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar14 = (psVar8->_M_dataplus)._M_p;
              sVar13 = psVar8->_M_string_length;
LAB_0023cad9:
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__return_storage_ptr__,pcVar14,pcVar14 + sVar13);
              return __return_storage_ptr__;
            }
            iVar2 = std::__cxx11::string::compare((char *)variable);
            if (iVar2 == 0) {
              targetType = cmGeneratorTarget::GetType(replaceValues->CMTarget);
              pcVar6 = cmState::GetTargetTypeName(targetType);
              goto LAB_0023c893;
            }
          }
          if ((replaceValues->Output == (char *)0x0) ||
             (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 != 0)) {
            iVar2 = std::__cxx11::string::compare((char *)variable);
            if (iVar2 == 0) {
              psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
              cmOutputConverter::Convert
                        (__return_storage_ptr__,&this->super_cmOutputConverter,psVar8,FULL,SHELL);
              return __return_storage_ptr__;
            }
            cmState::GetEnabledLanguages_abi_cxx11_
                      (&local_48,this->GlobalGenerator->CMakeInstance->State);
            paVar10 = &__return_storage_ptr__->field_2;
            local_a0 = &this->super_cmOutputConverter;
            ppcVar3 = ruleReplaceVars;
            local_60 = 0;
            local_a8 = paVar10;
            do {
              if (local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_58 = *ppcVar3;
                pbVar11 = local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pcVar6 = (pbVar11->_M_dataplus)._M_p;
                  local_50 = pbVar11;
                  std::__cxx11::string::string((string *)&local_108,local_58,(allocator *)&local_c8)
                  ;
                  iVar2 = std::__cxx11::string::compare((char *)&local_108);
                  if (iVar2 == 0) {
                    std::operator+(&local_c8,&local_108,"_ARG1");
                    cmsys::SystemTools::ReplaceString(&local_c8,"${LANG}",pcVar6);
                    local_68 = cmMakefile::GetDefinition(this->Makefile,&local_c8);
                    pcVar1 = this->Makefile;
                    local_e8[0] = local_d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_","");
                    plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_128._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_148._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    local_70 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if (local_e8[0] != local_d8) {
                      operator_delete(local_e8[0],local_d8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_e8[0] = local_d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_","");
                    plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_128._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_148._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    local_78 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if (local_e8[0] != local_d8) {
                      operator_delete(local_e8[0],local_d8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_e8[0] = local_d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_","");
                    plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_128._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_148._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    local_80 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if (local_e8[0] != local_d8) {
                      operator_delete(local_e8[0],local_d8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_e8[0] = local_d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_","");
                    plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_128._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_148._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    local_88 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if (local_e8[0] != local_d8) {
                      operator_delete(local_e8[0],local_d8[0] + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_148,"CMAKE_SYSROOT","");
                    local_90 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    pcVar1 = this->Makefile;
                    local_e8[0] = local_d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_","");
                    plVar4 = (long *)std::__cxx11::string::append((char *)local_e8);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar9;
                      local_128._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_128._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    psVar9 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar9) {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148.field_2._8_8_ = plVar4[3];
                    }
                    else {
                      local_148.field_2._M_allocated_capacity = *psVar9;
                      local_148._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_148._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar9;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    local_98 = cmMakefile::GetDefinition(pcVar1,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p,
                                      local_148.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if (local_e8[0] != local_d8) {
                      operator_delete(local_e8[0],local_d8[0] + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                               local_c8.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    local_68 = (char *)0x0;
                    local_70 = (char *)0x0;
                    local_78 = (char *)0x0;
                    local_80 = (char *)0x0;
                    local_88 = (char *)0x0;
                    local_90 = (char *)0x0;
                    local_98 = (char *)0x0;
                  }
                  lVar5 = std::__cxx11::string::find((char *)&local_108,0x4c51b6,0);
                  if (lVar5 != -1) {
                    cmsys::SystemTools::ReplaceString(&local_108,"${LANG}",pcVar6);
                  }
                  if (local_108._M_string_length == variable->_M_string_length) {
                    if (local_108._M_string_length == 0) {
                      bVar15 = true;
                    }
                    else {
                      iVar2 = bcmp(local_108._M_dataplus._M_p,(variable->_M_dataplus)._M_p,
                                   local_108._M_string_length);
                      bVar15 = iVar2 == 0;
                    }
                  }
                  else {
                    bVar15 = false;
                  }
                  if (bVar15) {
                    pcVar6 = cmMakefile::GetSafeDefinition(this->Makefile,variable);
                    std::__cxx11::string::string((string *)&local_c8,pcVar6,(allocator *)&local_148)
                    ;
                    lVar5 = std::__cxx11::string::find((char *)variable,0x4e8a57,0);
                    if (lVar5 == -1) {
                      cmOutputConverter::ConvertToOutputForExisting
                                (__return_storage_ptr__,local_a0,&local_c8,START_OUTPUT,SHELL);
                      if (local_68 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                      }
                      if (local_78 != (char *)0x0 && local_70 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                      }
                      if (local_88 != (char *)0x0 && local_80 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        pcVar6 = local_80;
                        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                        sVar7 = strlen(local_80);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_128,pcVar6,pcVar6 + sVar7);
                        cmOutputConverter::EscapeForShell
                                  (&local_148,local_a0,&local_128,true,false,false);
                        std::__cxx11::string::_M_append
                                  ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_148._M_dataplus._M_p != &local_148.field_2) {
                          operator_delete(local_148._M_dataplus._M_p,
                                          local_148.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_128._M_dataplus._M_p != &local_128.field_2) {
                          operator_delete(local_128._M_dataplus._M_p,
                                          local_128.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if (local_98 != (char *)0x0 && local_90 != (char *)0x0) {
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        std::__cxx11::string::append((char *)__return_storage_ptr__);
                        pcVar6 = local_90;
                        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                        sVar7 = strlen(local_90);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_128,pcVar6,pcVar6 + sVar7);
                        cmOutputConverter::EscapeForShell
                                  (&local_148,local_a0,&local_128,true,false,false);
                        std::__cxx11::string::_M_append
                                  ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_148._M_dataplus._M_p != &local_148.field_2) {
                          operator_delete(local_148._M_dataplus._M_p,
                                          local_148.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_128._M_dataplus._M_p != &local_128.field_2) {
                          operator_delete(local_128._M_dataplus._M_p,
                                          local_128.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                    else {
                      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
                        local_a8->_M_allocated_capacity =
                             CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                      local_c8.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)local_a8 + 8) = local_c8.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p = local_c8._M_dataplus._M_p;
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                      local_c8.field_2._M_local_buf[0]);
                      }
                      __return_storage_ptr__->_M_string_length = local_c8._M_string_length;
                      local_c8._M_string_length = 0;
                      local_c8.field_2._M_local_buf[0] = '\0';
                      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                               local_c8.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p,
                                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                               local_108.field_2._M_local_buf[0]) + 1);
                    }
                    if (bVar15) goto LAB_0023c7f6;
                  }
                  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                             local_108.field_2._M_local_buf[0]) + 1);
                  }
                  pbVar11 = local_50 + 1;
                  paVar10 = local_a8;
                } while (pbVar11 !=
                         local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              ppcVar3 = ruleReplaceVars + local_60 + 1;
              local_60 = local_60 + 1;
            } while (local_60 != 0xe);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar10;
            pcVar14 = (variable->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar14,pcVar14 + variable->_M_string_length
                      );
LAB_0023c7f6:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            return __return_storage_ptr__;
          }
          pcVar6 = replaceValues->Output;
        }
        else {
          pcVar6 = replaceValues->Language;
        }
      }
      else {
        pcVar6 = replaceValues->LinkLibraries;
      }
LAB_0023c893:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_108);
      return __return_storage_ptr__;
    }
    if (replaceValues->TargetSOName != (char *)0x0) {
      iVar2 = std::__cxx11::string::compare((char *)variable);
      if (iVar2 == 0) {
        pcVar6 = replaceValues->TargetSOName;
        goto LAB_0023c893;
      }
      iVar2 = std::__cxx11::string::compare((char *)variable);
      if ((iVar2 == 0) && (pcVar6 = replaceValues->SONameFlag, pcVar6 != (char *)0x0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar7 = strlen(pcVar6);
        pcVar12 = pcVar6 + sVar7;
        goto LAB_0023c91c;
      }
      if ((replaceValues->TargetInstallNameDir != (char *)0x0) &&
         (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
        pcVar6 = replaceValues->TargetInstallNameDir;
        goto LAB_0023c893;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "";
    pcVar6 = "";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_108);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&local_108);
      if (__return_storage_ptr__->_M_string_length < 3) {
        return __return_storage_ptr__;
      }
      pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (*pcVar6 != '\"') {
        return __return_storage_ptr__;
      }
      if (pcVar6[__return_storage_ptr__->_M_string_length - 1] != '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&local_108,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
LAB_0023cbd6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
    if ((replaceValues->LanguageCompileFlags != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar6 = replaceValues->LanguageCompileFlags;
      goto LAB_0023c893;
    }
    if ((replaceValues->Target != (char *)0x0) &&
       (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
      pcVar6 = replaceValues->Target;
      goto LAB_0023c893;
    }
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar14 = (this->TargetImplib)._M_dataplus._M_p;
      sVar13 = (this->TargetImplib)._M_string_length;
      goto LAB_0023cad9;
    }
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      pcVar6 = replaceValues->TargetVersionMajor;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)variable);
      if (iVar2 != 0) {
        if ((replaceValues->Target != (char *)0x0) &&
           (iVar2 = std::__cxx11::string::compare((char *)variable), iVar2 == 0)) {
          std::__cxx11::string::string
                    ((string *)&local_108,replaceValues->Target,(allocator *)&local_c8);
          lVar5 = std::__cxx11::string::rfind((char *)&local_108,0x4d112a,0xffffffffffffffff);
          if (lVar5 == -1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p == &local_108.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                            local_108.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_108._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                            local_108.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = local_108._M_string_length;
            local_108._M_string_length = 0;
            local_108.field_2._M_local_buf[0] = '\0';
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_108);
          }
          goto LAB_0023cbd6;
        }
        goto LAB_0023bb26;
      }
      pcVar6 = replaceValues->TargetVersionMinor;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "0";
      pcVar12 = "";
    }
    else {
      sVar7 = strlen(pcVar6);
      pcVar12 = pcVar6 + sVar7;
    }
  }
LAB_0023c91c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar12);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ExpandRuleVariable(std::string const& variable,
                                     const RuleVariables& replaceValues)
{
  if(replaceValues.LinkFlags)
    {
    if(variable == "LINK_FLAGS")
      {
      return replaceValues.LinkFlags;
      }
    }
  if(replaceValues.Manifests)
    {
    if(variable == "MANIFESTS")
      {
      return replaceValues.Manifests;
      }
    }
  if(replaceValues.Flags)
    {
    if(variable == "FLAGS")
      {
      return replaceValues.Flags;
      }
    }

  if(replaceValues.Source)
    {
    if(variable == "SOURCE")
      {
      return replaceValues.Source;
      }
    }
  if(replaceValues.PreprocessedSource)
    {
    if(variable == "PREPROCESSED_SOURCE")
      {
      return replaceValues.PreprocessedSource;
      }
    }
  if(replaceValues.AssemblySource)
    {
    if(variable == "ASSEMBLY_SOURCE")
      {
      return replaceValues.AssemblySource;
      }
    }
  if(replaceValues.Object)
    {
    if(variable == "OBJECT")
      {
      return replaceValues.Object;
      }
    }
  if(replaceValues.ObjectDir)
    {
    if(variable == "OBJECT_DIR")
      {
      return replaceValues.ObjectDir;
      }
    }
  if(replaceValues.ObjectFileDir)
    {
    if(variable == "OBJECT_FILE_DIR")
      {
      return replaceValues.ObjectFileDir;
      }
    }
  if(replaceValues.Objects)
    {
    if(variable == "OBJECTS")
      {
      return replaceValues.Objects;
      }
    }
  if(replaceValues.ObjectsQuoted)
    {
    if(variable == "OBJECTS_QUOTED")
      {
      return replaceValues.ObjectsQuoted;
      }
    }
  if(replaceValues.Defines && variable == "DEFINES")
    {
    return replaceValues.Defines;
    }
  if(replaceValues.Includes && variable == "INCLUDES")
    {
    return replaceValues.Includes;
    }
  if(replaceValues.TargetPDB )
    {
    if(variable == "TARGET_PDB")
      {
      return replaceValues.TargetPDB;
      }
    }
  if(replaceValues.TargetCompilePDB)
    {
    if(variable == "TARGET_COMPILE_PDB")
      {
      return replaceValues.TargetCompilePDB;
      }
    }
  if(replaceValues.DependencyFile )
    {
    if(variable == "DEP_FILE")
      {
      return replaceValues.DependencyFile;
      }
    }

  if(replaceValues.Target)
    {
    if(variable == "TARGET_QUOTED")
      {
      std::string targetQuoted = replaceValues.Target;
      if(!targetQuoted.empty() && targetQuoted[0] != '\"')
        {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
        }
      return targetQuoted;
      }
    if(variable == "TARGET_UNQUOTED")
      {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if(sz > 2 && unquoted[0] == '\"' && unquoted[sz-1] == '\"')
        {
        unquoted = unquoted.substr(1, sz-2);
        }
      return unquoted;
      }
    if(replaceValues.LanguageCompileFlags)
      {
      if(variable == "LANGUAGE_COMPILE_FLAGS")
        {
        return replaceValues.LanguageCompileFlags;
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET")
        {
        return replaceValues.Target;
        }
      }
    if(variable == "TARGET_IMPLIB")
      {
      return this->TargetImplib;
      }
    if(variable == "TARGET_VERSION_MAJOR")
      {
      if(replaceValues.TargetVersionMajor)
        {
        return replaceValues.TargetVersionMajor;
        }
      else
        {
        return "0";
        }
      }
    if(variable == "TARGET_VERSION_MINOR")
      {
      if(replaceValues.TargetVersionMinor)
        {
        return replaceValues.TargetVersionMinor;
        }
      else
        {
        return "0";
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET_BASE")
        {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind(".");
        if(pos != targetBase.npos)
          {
        return targetBase.substr(0, pos);
          }
        else
          {
          return targetBase;
          }
        }
      }
    }
  if(variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
     variable == "TARGET_INSTALLNAME_DIR")
    {
    // All these variables depend on TargetSOName
    if(replaceValues.TargetSOName)
      {
      if(variable == "TARGET_SONAME")
        {
        return replaceValues.TargetSOName;
        }
      if(variable == "SONAME_FLAG" && replaceValues.SONameFlag)
        {
        return replaceValues.SONameFlag;
        }
      if(replaceValues.TargetInstallNameDir &&
         variable == "TARGET_INSTALLNAME_DIR")
        {
        return replaceValues.TargetInstallNameDir;
        }
      }
    return "";
    }
  if(replaceValues.LinkLibraries)
    {
    if(variable == "LINK_LIBRARIES")
      {
      return replaceValues.LinkLibraries;
      }
    }
  if(replaceValues.Language)
    {
    if(variable == "LANGUAGE")
      {
      return replaceValues.Language;
      }
    }
  if(replaceValues.CMTarget)
    {
    if(variable == "TARGET_NAME")
      {
      return replaceValues.CMTarget->GetName();
      }
    if(variable == "TARGET_TYPE")
      {
      return cmState::GetTargetTypeName(replaceValues.CMTarget->GetType());
      }
    }
  if(replaceValues.Output)
    {
    if(variable == "OUTPUT")
      {
      return replaceValues.Output;
      }
    }
  if(variable == "CMAKE_COMMAND")
    {
    return this->Convert(cmSystemTools::GetCMakeCommand(), FULL, SHELL);
    }
  std::vector<std::string> enabledLanguages =
      this->GetState()->GetEnabledLanguages();
  // loop over language specific replace variables
  int pos = 0;
  while(ruleReplaceVars[pos])
    {
    for(std::vector<std::string>::iterator i = enabledLanguages.begin();
        i != enabledLanguages.end(); ++i)
      {
      const char* lang = i->c_str();
      std::string actualReplace = ruleReplaceVars[pos];
      // If this is the compiler then look for the extra variable
      // _COMPILER_ARG1 which must be the first argument to the compiler
      const char* compilerArg1 = 0;
      const char* compilerTarget = 0;
      const char* compilerOptionTarget = 0;
      const char* compilerExternalToolchain = 0;
      const char* compilerOptionExternalToolchain = 0;
      const char* compilerSysroot = 0;
      const char* compilerOptionSysroot = 0;
      if(actualReplace == "CMAKE_${LANG}_COMPILER")
        {
        std::string arg1 = actualReplace + "_ARG1";
        cmSystemTools::ReplaceString(arg1, "${LANG}", lang);
        compilerArg1 = this->Makefile->GetDefinition(arg1);
        compilerTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang + "_COMPILER_TARGET");
        compilerOptionTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                          "_COMPILE_OPTIONS_TARGET");
        compilerExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                    "_COMPILER_EXTERNAL_TOOLCHAIN");
        compilerOptionExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
        compilerSysroot
              = this->Makefile->GetDefinition("CMAKE_SYSROOT");
        compilerOptionSysroot
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_SYSROOT");
        }
      if(actualReplace.find("${LANG}") != actualReplace.npos)
        {
        cmSystemTools::ReplaceString(actualReplace, "${LANG}", lang);
        }
      if(actualReplace == variable)
        {
        std::string replace =
          this->Makefile->GetSafeDefinition(variable);
        // if the variable is not a FLAG then treat it like a path
        if(variable.find("_FLAG") == variable.npos)
          {
          std::string ret = this->ConvertToOutputForExisting(replace);
          // if there is a required first argument to the compiler add it
          // to the compiler string
          if(compilerArg1)
            {
            ret += " ";
            ret += compilerArg1;
            }
          if (compilerTarget && compilerOptionTarget)
            {
            ret += " ";
            ret += compilerOptionTarget;
            ret += compilerTarget;
            }
          if (compilerExternalToolchain && compilerOptionExternalToolchain)
            {
            ret += " ";
            ret += compilerOptionExternalToolchain;
            ret += this->EscapeForShell(compilerExternalToolchain, true);
            }
          if (compilerSysroot && compilerOptionSysroot)
            {
            ret += " ";
            ret += compilerOptionSysroot;
            ret += this->EscapeForShell(compilerSysroot, true);
            }
          return ret;
          }
        return replace;
        }
      }
    pos++;
    }
  return variable;
}